

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode Curl_mime_duppart(Curl_easy *data,curl_mimepart *dst,curl_mimepart *src)

{
  curl_off_t cVar1;
  curl_read_callback p_Var2;
  curl_seek_callback p_Var3;
  curl_free_callback p_Var4;
  void *pvVar5;
  mimekind mVar6;
  mimekind mVar7;
  curl_mime *subparts;
  curl_mimepart *dst_00;
  char *pcVar8;
  curl_slist *headers;
  curl_mimepart *src_00;
  
  mVar6 = src->kind;
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    mVar6 = curl_mime_data(dst,src->data,src->datasize);
    break;
  case MIMEKIND_FILE:
    mVar7 = curl_mime_filedata(dst,src->data);
    mVar6 = MIMEKIND_NONE;
    if (mVar7 != 0x1a) {
      mVar6 = mVar7;
    }
    break;
  case MIMEKIND_CALLBACK:
    if (dst == (curl_mimepart *)0x0) goto switchD_006097f6_default;
    cVar1 = src->datasize;
    p_Var2 = src->readfunc;
    p_Var3 = src->seekfunc;
    p_Var4 = src->freefunc;
    pvVar5 = src->arg;
    cleanup_part_content(dst);
    mVar6 = MIMEKIND_NONE;
    if (p_Var2 != (curl_read_callback)0x0) {
      dst->readfunc = p_Var2;
      dst->seekfunc = p_Var3;
      dst->freefunc = p_Var4;
      dst->arg = pvVar5;
      dst->datasize = cVar1;
      dst->kind = MIMEKIND_CALLBACK;
    }
    break;
  case MIMEKIND_MULTIPART:
    subparts = curl_mime_init(data);
    if (subparts == (curl_mime *)0x0) {
      mVar6 = 0x1b;
    }
    else {
      mVar6 = Curl_mime_set_subparts(dst,subparts,1);
    }
    src_00 = *(curl_mimepart **)((long)src->arg + 8);
    if (src_00 != (curl_mimepart *)0x0 && mVar6 == MIMEKIND_NONE) {
      do {
        dst_00 = curl_mime_addpart(subparts);
        if (dst_00 == (curl_mimepart *)0x0) {
          mVar6 = 0x1b;
        }
        else {
          mVar6 = Curl_mime_duppart(data,dst_00,src_00);
        }
      } while ((mVar6 == MIMEKIND_NONE) &&
              (src_00 = src_00->nextpart, src_00 != (curl_mimepart *)0x0));
    }
    break;
  default:
switchD_006097f6_default:
    mVar6 = 0x2b;
  }
  if (mVar6 == MIMEKIND_NONE) {
    mVar6 = MIMEKIND_NONE;
    if (src->userheaders != (curl_slist *)0x0) {
      headers = Curl_slist_duplicate(src->userheaders);
      if (headers == (curl_slist *)0x0) {
        mVar6 = 0x1b;
      }
      else {
        mVar7 = curl_mime_headers(dst,headers,1);
        if (mVar7 != MIMEKIND_NONE) {
          curl_slist_free_all(headers);
          mVar6 = mVar7;
        }
      }
    }
  }
  if (mVar6 == MIMEKIND_NONE) {
    dst->encoder = src->encoder;
    if (dst == (curl_mimepart *)0x0) {
      mVar6 = 0x2b;
    }
    else {
      pcVar8 = src->mimetype;
      (*Curl_cfree)(dst->mimetype);
      dst->mimetype = (char *)0x0;
      if (pcVar8 != (char *)0x0) {
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        dst->mimetype = pcVar8;
        if (pcVar8 == (char *)0x0) {
          mVar6 = 0x1b;
          goto LAB_006099c7;
        }
      }
      mVar6 = MIMEKIND_NONE;
    }
  }
LAB_006099c7:
  if (mVar6 == MIMEKIND_NONE) {
    if (dst == (curl_mimepart *)0x0) {
      mVar6 = 0x2b;
    }
    else {
      pcVar8 = src->name;
      (*Curl_cfree)(dst->name);
      dst->name = (char *)0x0;
      if (pcVar8 != (char *)0x0) {
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        dst->name = pcVar8;
        if (pcVar8 == (char *)0x0) {
          mVar6 = 0x1b;
          goto LAB_00609a17;
        }
      }
      mVar6 = MIMEKIND_NONE;
    }
  }
LAB_00609a17:
  if (mVar6 == MIMEKIND_NONE) {
    if (dst == (curl_mimepart *)0x0) {
      mVar6 = 0x2b;
    }
    else {
      pcVar8 = src->filename;
      (*Curl_cfree)(dst->filename);
      dst->filename = (char *)0x0;
      if (pcVar8 != (char *)0x0) {
        pcVar8 = (*Curl_cstrdup)(pcVar8);
        dst->filename = pcVar8;
        if (pcVar8 == (char *)0x0) {
          mVar6 = 0x1b;
          goto LAB_00609a67;
        }
      }
      mVar6 = MIMEKIND_NONE;
    }
  }
LAB_00609a67:
  if (mVar6 != MIMEKIND_NONE) {
    Curl_mime_cleanpart(dst);
  }
  return mVar6;
}

Assistant:

CURLcode Curl_mime_duppart(struct Curl_easy *data,
                           curl_mimepart *dst, const curl_mimepart *src)
{
  curl_mime *mime;
  curl_mimepart *d;
  const curl_mimepart *s;
  CURLcode res = CURLE_OK;

  DEBUGASSERT(dst);

  /* Duplicate content. */
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    res = curl_mime_data(dst, src->data, (size_t) src->datasize);
    break;
  case MIMEKIND_FILE:
    res = curl_mime_filedata(dst, src->data);
    /* Do not abort duplication if file is not readable. */
    if(res == CURLE_READ_ERROR)
      res = CURLE_OK;
    break;
  case MIMEKIND_CALLBACK:
    res = curl_mime_data_cb(dst, src->datasize, src->readfunc,
                            src->seekfunc, src->freefunc, src->arg);
    break;
  case MIMEKIND_MULTIPART:
    /* No one knows about the cloned subparts, thus always attach ownership
       to the part. */
    mime = curl_mime_init(data);
    res = mime? curl_mime_subparts(dst, mime): CURLE_OUT_OF_MEMORY;

    /* Duplicate subparts. */
    for(s = ((curl_mime *) src->arg)->firstpart; !res && s; s = s->nextpart) {
      d = curl_mime_addpart(mime);
      res = d? Curl_mime_duppart(data, d, s): CURLE_OUT_OF_MEMORY;
    }
    break;
  default:  /* Invalid kind: should not occur. */
    DEBUGF(infof(data, "invalid MIMEKIND* attempt"));
    res = CURLE_BAD_FUNCTION_ARGUMENT;  /* Internal error? */
    break;
  }

  /* Duplicate headers. */
  if(!res && src->userheaders) {
    struct curl_slist *hdrs = Curl_slist_duplicate(src->userheaders);

    if(!hdrs)
      res = CURLE_OUT_OF_MEMORY;
    else {
      /* No one but this procedure knows about the new header list,
         so always take ownership. */
      res = curl_mime_headers(dst, hdrs, TRUE);
      if(res)
        curl_slist_free_all(hdrs);
    }
  }

  if(!res) {
    /* Duplicate other fields. */
    dst->encoder = src->encoder;
    res = curl_mime_type(dst, src->mimetype);
  }
  if(!res)
    res = curl_mime_name(dst, src->name);
  if(!res)
    res = curl_mime_filename(dst, src->filename);

  /* If an error occurred, rollback. */
  if(res)
    Curl_mime_cleanpart(dst);

  return res;
}